

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

Component ftxui::Button(ConstStringRef *label,function<void_()> *on_click,
                       Ref<ftxui::ButtonOption> option)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Component CVar2;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ButtonBase,_std::allocator<ftxui::(anonymous_namespace)::ButtonBase>,_(__gnu_cxx::_Lock_policy)2>_>
  local_99;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ButtonBase,_std::allocator<ftxui::(anonymous_namespace)::ButtonBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_98;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  function<void_()> local_78;
  ConstStringRef local_58;
  
  local_88 = 0;
  p_Var1 = (pointer)operator_new(0xa0);
  local_98._M_alloc = &local_99;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00167de0;
  local_98._M_ptr = p_Var1;
  ConstStringRef::ConstStringRef(&local_58,(ConstStringRef *)on_click);
  std::function<void_()>::function(&local_78,option._0_8_);
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__ButtonBase_00167e30;
  ConstStringRef::ConstStringRef
            ((ConstStringRef *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28),&local_58);
  std::function<void_()>::function
            ((function<void_()> *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x50),&local_78)
  ;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x70) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x78) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__data[0x80] = (uchar)option.address_;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x88) = in_R8;
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::__cxx11::string::~string((string *)&local_58);
  local_98._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ButtonBase,_std::allocator<ftxui::(anonymous_namespace)::ButtonBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_98);
  (label->owned_)._M_dataplus._M_p = (pointer)&p_Var1->_M_impl;
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (label->owned_)._M_string_length = (size_type)p_Var1;
  local_88 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)label;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Button(ConstStringRef label,
                 std::function<void()> on_click,
                 Ref<ButtonOption> option) {
  return Make<ButtonBase>(label, std::move(on_click), std::move(option));
}